

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O2

string * __thiscall
phosg::join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,phosg *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x10);
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x20);
  lVar3 = *(long *)(this + 0x28);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x30);
  while (__str != pbVar1) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,__str);
    __str = __str + 1;
    if (__str == pbVar2) {
      __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar3 + 8);
      lVar3 = lVar3 + 8;
      pbVar2 = __str + 0x10;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const ItemContainerT& items) {
  std::string ret;
  for (const auto& item : items) {
    ret += item;
  }
  return ret;
}